

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::makePageResident
          (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this,size_t pageNdx)

{
  int iVar1;
  size_type sVar2;
  Resource *pRVar3;
  reference pvVar4;
  reference local_40;
  unsigned_long local_30;
  size_t numBytesToRead;
  size_t pageOffset;
  size_t pageSize;
  size_t pageNdx_local;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this_local;
  
  pageOffset = 0x2000;
  numBytesToRead = pageNdx << 0xd;
  pageSize = pageNdx;
  pageNdx_local = (size_t)this;
  sVar2 = std::
          vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
          ::size(&this->m_elements);
  local_30 = de::min<unsigned_long>(sVar2 * 8 - numBytesToRead,0x2000);
  pRVar3 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)this);
  iVar1 = (*pRVar3->_vptr_Resource[4])();
  if ((long)iVar1 != numBytesToRead) {
    pRVar3 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                       ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)this);
    (*pRVar3->_vptr_Resource[5])(pRVar3,numBytesToRead & 0xffffffff);
  }
  pRVar3 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)this);
  pvVar4 = std::
           vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
           ::operator[](&this->m_elements,pageSize << 10);
  (*pRVar3->_vptr_Resource[2])(pRVar3,pvVar4,local_30 & 0xffffffff);
  local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_isPageResident,pageSize);
  std::_Bit_reference::operator=(&local_40,true);
  return;
}

Assistant:

void LazyResource<Element>::makePageResident (size_t pageNdx)
{
	const size_t	pageSize		= (size_t)(1<<ELEMENTS_PER_PAGE_LOG2)*sizeof(Element);
	const size_t	pageOffset		= pageNdx*pageSize;
	const size_t	numBytesToRead	= de::min(m_elements.size()*sizeof(Element) - pageOffset, pageSize);

	DE_ASSERT(!isPageResident(pageNdx));

	if ((size_t)m_resource->getPosition() != pageOffset)
		m_resource->setPosition((int)pageOffset);

	m_resource->read((deUint8*)&m_elements[pageNdx << ELEMENTS_PER_PAGE_LOG2], (int)numBytesToRead);
	m_isPageResident[pageNdx] = true;
}